

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O1

void __thiscall hmi::window::set_title(window *this,string_view title)

{
  string title_string;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,title._M_str,title._M_str + title._M_len);
  SDL_SetWindowTitle(this->m_window,local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void window::set_title(std::string_view title) {
    std::string title_string(title);
    SDL_SetWindowTitle(m_window, title_string.data());
  }